

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::anon_unknown_0::VertexAttributeDivisorCase::test
          (VertexAttributeDivisorCase *this)

{
  CallLogWrapper *gl;
  TestLog *pTVar1;
  GLenum in_R8D;
  allocator<char> local_62;
  allocator<char> local_61;
  ScopedLogSection section;
  GLuint vaos [2];
  string local_38;
  
  pTVar1 = (this->super_ApiCase).m_log;
  std::__cxx11::string::string<std::allocator<char>>((string *)vaos,"DefaultVAO",&local_61);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"Test with default VAO",&local_62);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar1,(string *)vaos,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)vaos);
  gl = &(this->super_ApiCase).super_CallLogWrapper;
  verifyVertexAttrib((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,gl
                     ,0x88fe,0,in_R8D);
  glu::CallLogWrapper::glVertexAttribDivisor(gl,0,1);
  verifyVertexAttrib((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,gl
                     ,0x88fe,1,in_R8D);
  glu::CallLogWrapper::glVertexAttribDivisor(gl,0,5);
  verifyVertexAttrib((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,gl
                     ,0x88fe,5,in_R8D);
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  pTVar1 = (this->super_ApiCase).m_log;
  std::__cxx11::string::string<std::allocator<char>>((string *)vaos,"WithVAO",&local_61);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Test with VAO",&local_62);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar1,(string *)vaos,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)vaos);
  vaos[0] = 0;
  vaos[1] = 0;
  glu::CallLogWrapper::glGenVertexArrays(gl,2,vaos);
  ApiCase::expectError(&this->super_ApiCase,0);
  glu::CallLogWrapper::glBindVertexArray(gl,vaos[0]);
  glu::CallLogWrapper::glVertexAttribDivisor(gl,0,1);
  ApiCase::expectError(&this->super_ApiCase,0);
  glu::CallLogWrapper::glBindVertexArray(gl,vaos[1]);
  glu::CallLogWrapper::glVertexAttribDivisor(gl,0,5);
  ApiCase::expectError(&this->super_ApiCase,0);
  verifyVertexAttrib((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,gl
                     ,0x88fe,5,in_R8D);
  ApiCase::expectError(&this->super_ApiCase,0);
  glu::CallLogWrapper::glBindVertexArray(gl,vaos[0]);
  verifyVertexAttrib((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,gl
                     ,0x88fe,1,in_R8D);
  ApiCase::expectError(&this->super_ApiCase,0);
  glu::CallLogWrapper::glDeleteVertexArrays(gl,2,vaos);
  ApiCase::expectError(&this->super_ApiCase,0);
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  return;
}

Assistant:

void test (void)
	{
		// Test with default VAO
		{
			const tcu::ScopedLogSection section(m_log, "DefaultVAO", "Test with default VAO");

			verifyVertexAttrib(m_testCtx, *this, 0, GL_VERTEX_ATTRIB_ARRAY_DIVISOR,	0);
			glVertexAttribDivisor(0, 1);
			verifyVertexAttrib(m_testCtx, *this, 0, GL_VERTEX_ATTRIB_ARRAY_DIVISOR,	1);
			glVertexAttribDivisor(0, 5);
			verifyVertexAttrib(m_testCtx, *this, 0, GL_VERTEX_ATTRIB_ARRAY_DIVISOR,	5);
		}

		// Test with multiple VAOs
		{
			const tcu::ScopedLogSection section(m_log, "WithVAO", "Test with VAO");

			GLuint vaos[2] = {0};

			glGenVertexArrays(2, vaos);
			expectError(GL_NO_ERROR);

			// set vao 0 to some value
			glBindVertexArray(vaos[0]);
			glVertexAttribDivisor(0, 1);
			expectError(GL_NO_ERROR);

			// set vao 1 to some other value
			glBindVertexArray(vaos[1]);
			glVertexAttribDivisor(0, 5);
			expectError(GL_NO_ERROR);

			// verify vao 1 state
			verifyVertexAttrib(m_testCtx, *this, 0, GL_VERTEX_ATTRIB_ARRAY_DIVISOR, 5);
			expectError(GL_NO_ERROR);

			// verify vao 0 state
			glBindVertexArray(vaos[0]);
			verifyVertexAttrib(m_testCtx, *this, 0, GL_VERTEX_ATTRIB_ARRAY_DIVISOR, 1);
			expectError(GL_NO_ERROR);

			glDeleteVertexArrays(2, vaos);
			expectError(GL_NO_ERROR);
		}
	}